

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

VkShaderStageFlags Diligent::ShaderTypesToVkShaderStageFlags(SHADER_TYPE ShaderTypes)

{
  VkShaderStageFlagBits VVar1;
  VkShaderStageFlags Result;
  VkShaderStageFlagBits VVar2;
  
  VVar2 = 0;
  for (; ShaderTypes != SHADER_TYPE_UNKNOWN; ShaderTypes = ShaderTypes ^ -ShaderTypes & ShaderTypes)
  {
    VVar1 = ShaderTypeToVkShaderStageFlagBit(-ShaderTypes & ShaderTypes);
    VVar2 = VVar2 | VVar1;
  }
  return VVar2;
}

Assistant:

VkShaderStageFlags ShaderTypesToVkShaderStageFlags(SHADER_TYPE ShaderTypes)
{
    VkShaderStageFlags Result = 0;
    while (ShaderTypes != SHADER_TYPE_UNKNOWN)
    {
        SHADER_TYPE Type = ExtractLSB(ShaderTypes);
        Result |= ShaderTypeToVkShaderStageFlagBit(Type);
    }
    return Result;
}